

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O3

int xmlStreamCtxtAddState(xmlStreamCtxtPtr comp,int idx,int level)

{
  ulong uVar1;
  int *piVar2;
  int iVar3;
  
  iVar3 = comp->nbState;
  if (0 < (long)iVar3) {
    piVar2 = comp->states;
    uVar1 = 0;
    do {
      if (piVar2[uVar1 * 2] < 0) {
        piVar2[uVar1 * 2] = idx;
        piVar2[uVar1 * 2 + 1] = level;
        goto LAB_0016ce69;
      }
      uVar1 = uVar1 + 1;
    } while ((long)iVar3 != uVar1);
  }
  if (iVar3 < comp->maxState) {
    piVar2 = comp->states;
  }
  else {
    piVar2 = (int *)(*xmlRealloc)(comp->states,(long)comp->maxState << 4);
    if (piVar2 == (int *)0x0) {
      uVar1 = 0xffffffff;
      goto LAB_0016ce69;
    }
    comp->states = piVar2;
    comp->maxState = comp->maxState << 1;
    iVar3 = comp->nbState;
  }
  piVar2[iVar3 * 2] = idx;
  iVar3 = comp->nbState;
  comp->nbState = iVar3 + 1;
  piVar2[(long)iVar3 * 2 + 1] = level;
  uVar1 = (ulong)(comp->nbState - 1);
LAB_0016ce69:
  return (int)uVar1;
}

Assistant:

static int
xmlStreamCtxtAddState(xmlStreamCtxtPtr comp, int idx, int level) {
    int i;
    for (i = 0;i < comp->nbState;i++) {
        if (comp->states[2 * i] < 0) {
	    comp->states[2 * i] = idx;
	    comp->states[2 * i + 1] = level;
	    return(i);
	}
    }
    if (comp->nbState >= comp->maxState) {
        int *cur;

	cur = (int *) xmlRealloc(comp->states,
				 comp->maxState * 4 * sizeof(int));
	if (cur == NULL) {
	    ERROR(NULL, NULL, NULL,
		  "xmlNewStreamCtxt: malloc failed\n");
	    return(-1);
	}
	comp->states = cur;
        comp->maxState *= 2;
    }
    comp->states[2 * comp->nbState] = idx;
    comp->states[2 * comp->nbState++ + 1] = level;
    return(comp->nbState - 1);
}